

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

void __thiscall Kvm::displayValue(Kvm *this,Value *v,ostream *out)

{
  ValueType VVar1;
  char *local_40;
  ostream *out_local;
  Value *v_local;
  Kvm *this_local;
  
  if (((ulong)v & 1) == 1) {
    std::ostream::operator<<(out,(long)v >> 1);
  }
  else if (((ulong)v & 2) == 2) {
    std::operator<<(out,(char)((long)v >> 2));
  }
  else {
    VVar1 = Value::type(v);
    switch(VVar1) {
    case BOOLEAN:
      if (((ulong)v[1]._vptr_Value & 1) == 0) {
        local_40 = "#f";
      }
      else {
        local_40 = "#t";
      }
      std::operator<<(out,local_40);
      break;
    case STRING:
      std::operator<<(out,(char *)v[1]._vptr_Value);
      break;
    default:
      std::operator<<(out,"`display` primitive is not implemented for this object");
      break;
    case CELL:
      std::operator<<(out,'(');
      displayCell(this,v,out);
      std::operator<<(out,')');
      break;
    case SYMBOL:
      std::operator<<(out,(char *)v[1]._vptr_Value);
    }
  }
  return;
}

Assistant:

void Kvm::displayValue(const Value *v, std::ostream &out)
{
    if (IS_INT(v))
    {
        out << TK_INT(v);
    } else if (IS_CHR(v))
    {
        out << TK_CHR(v);
    } else 
    {
        switch (v->type())
        {
            case ValueType::BOOLEAN:
                out << (static_cast<const Boolean *>(v)->value_ ? "#t" : "#f");
                break;
            case ValueType::STRING:
                out << (static_cast<const String *>(v)->value_);
                break;
            case ValueType::SYMBOL:
                out << (static_cast<const String *>(v)->value_);
                break;
            case ValueType::CELL:
                out << '(';
                displayCell(v, out);
                out << ')';
                break;
            default:
                out << "`display` primitive is not implemented for this object";
                break;
        }
    }
}